

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GateTypes.cpp
# Opt level: O1

void slang::ast::builtins::registerGateTypes(Compilation *c)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  string_view name_15;
  string_view name_16;
  string_view name_17;
  string_view name_18;
  string_view name_19;
  string_view name_20;
  string_view name_21;
  string_view name_22;
  string_view name_23;
  string_view name_24;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_00;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_01;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_02;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_03;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_04;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_05;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_06;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_07;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_08;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_09;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_10;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_11;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_12;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_13;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_14;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_15;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_16;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_17;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_18;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_19;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_20;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_21;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_22;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_23;
  initializer_list<slang::ast::PrimitivePortDirection> portDirs_24;
  PrimitivePortDirection local_48 [2];
  ulong uStack_40;
  
  local_48[0] = Out;
  local_48[1] = In;
  uStack_40 = 0;
  name._M_str = "cmos";
  name._M_len = 4;
  portDirs._M_len = 4;
  portDirs._M_array = local_48;
  gate(c,name,portDirs,Fixed);
  local_48[0] = Out;
  local_48[1] = In;
  uStack_40 = 0;
  name_00._M_str = "rcmos";
  name_00._M_len = 5;
  portDirs_00._M_len = 4;
  portDirs_00._M_array = local_48;
  gate(c,name_00,portDirs_00,Fixed);
  local_48[0] = Out;
  local_48[1] = In;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  name_01._M_str = "bufif0";
  name_01._M_len = 6;
  portDirs_01._M_len = 3;
  portDirs_01._M_array = local_48;
  gate(c,name_01,portDirs_01,Fixed);
  local_48[0] = Out;
  local_48[1] = In;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  name_02._M_str = "bufif1";
  name_02._M_len = 6;
  portDirs_02._M_len = 3;
  portDirs_02._M_array = local_48;
  gate(c,name_02,portDirs_02,Fixed);
  local_48[0] = Out;
  local_48[1] = In;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  name_03._M_str = "notif0";
  name_03._M_len = 6;
  portDirs_03._M_len = 3;
  portDirs_03._M_array = local_48;
  gate(c,name_03,portDirs_03,Fixed);
  local_48[0] = Out;
  local_48[1] = In;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  name_04._M_str = "notif1";
  name_04._M_len = 6;
  portDirs_04._M_len = 3;
  portDirs_04._M_array = local_48;
  gate(c,name_04,portDirs_04,Fixed);
  local_48[0] = Out;
  local_48[1] = In;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  name_05._M_str = "nmos";
  name_05._M_len = 4;
  portDirs_05._M_len = 3;
  portDirs_05._M_array = local_48;
  gate(c,name_05,portDirs_05,Fixed);
  local_48[0] = Out;
  local_48[1] = In;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  name_06._M_str = "pmos";
  name_06._M_len = 4;
  portDirs_06._M_len = 3;
  portDirs_06._M_array = local_48;
  gate(c,name_06,portDirs_06,Fixed);
  local_48[0] = Out;
  local_48[1] = In;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  name_07._M_str = "rnmos";
  name_07._M_len = 5;
  portDirs_07._M_len = 3;
  portDirs_07._M_array = local_48;
  gate(c,name_07,portDirs_07,Fixed);
  local_48[0] = Out;
  local_48[1] = In;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  name_08._M_str = "rpmos";
  name_08._M_len = 5;
  portDirs_08._M_len = 3;
  portDirs_08._M_array = local_48;
  gate(c,name_08,portDirs_08,Fixed);
  local_48[0] = InOut;
  local_48[1] = InOut;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  name_09._M_str = "tranif0";
  name_09._M_len = 7;
  portDirs_09._M_len = 3;
  portDirs_09._M_array = local_48;
  gate(c,name_09,portDirs_09,BiDiSwitch);
  local_48[0] = InOut;
  local_48[1] = InOut;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  name_10._M_str = "tranif1";
  name_10._M_len = 7;
  portDirs_10._M_len = 3;
  portDirs_10._M_array = local_48;
  gate(c,name_10,portDirs_10,BiDiSwitch);
  local_48[0] = InOut;
  local_48[1] = InOut;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  name_11._M_str = "rtranif0";
  name_11._M_len = 8;
  portDirs_11._M_len = 3;
  portDirs_11._M_array = local_48;
  gate(c,name_11,portDirs_11,Fixed);
  local_48[0] = InOut;
  local_48[1] = InOut;
  uStack_40 = uStack_40 & 0xffffffff00000000;
  name_12._M_str = "rtranif1";
  name_12._M_len = 8;
  portDirs_12._M_len = 3;
  portDirs_12._M_array = local_48;
  gate(c,name_12,portDirs_12,Fixed);
  local_48[0] = InOut;
  local_48[1] = InOut;
  name_13._M_str = "tran";
  name_13._M_len = 4;
  portDirs_13._M_len = 2;
  portDirs_13._M_array = local_48;
  gate(c,name_13,portDirs_13,BiDiSwitch);
  local_48[0] = InOut;
  local_48[1] = InOut;
  name_14._M_str = "rtran";
  name_14._M_len = 5;
  portDirs_14._M_len = 2;
  portDirs_14._M_array = local_48;
  gate(c,name_14,portDirs_14,Fixed);
  local_48[0] = Out;
  name_15._M_str = "pullup";
  name_15._M_len = 6;
  portDirs_15._M_len = 1;
  portDirs_15._M_array = local_48;
  gate(c,name_15,portDirs_15,Fixed);
  local_48[0] = 1;
  name_16._M_str = "pulldown";
  name_16._M_len = 8;
  portDirs_16._M_len = 1;
  portDirs_16._M_array = local_48;
  gate(c,name_16,portDirs_16,Fixed);
  local_48[0] = Out;
  local_48[1] = In;
  name_17._M_str = "and";
  name_17._M_len = 3;
  portDirs_17._M_len = 2;
  portDirs_17._M_array = local_48;
  gate(c,name_17,portDirs_17,NInput);
  local_48[0] = Out;
  local_48[1] = In;
  name_18._M_str = "or";
  name_18._M_len = 2;
  portDirs_18._M_len = 2;
  portDirs_18._M_array = local_48;
  gate(c,name_18,portDirs_18,NInput);
  local_48[0] = Out;
  local_48[1] = In;
  name_19._M_str = "nand";
  name_19._M_len = 4;
  portDirs_19._M_len = 2;
  portDirs_19._M_array = local_48;
  gate(c,name_19,portDirs_19,NInput);
  local_48[0] = Out;
  local_48[1] = In;
  name_20._M_str = "nor";
  name_20._M_len = 3;
  portDirs_20._M_len = 2;
  portDirs_20._M_array = local_48;
  gate(c,name_20,portDirs_20,NInput);
  local_48[0] = Out;
  local_48[1] = In;
  name_21._M_str = "xor";
  name_21._M_len = 3;
  portDirs_21._M_len = 2;
  portDirs_21._M_array = local_48;
  gate(c,name_21,portDirs_21,NInput);
  local_48[0] = Out;
  local_48[1] = In;
  name_22._M_str = "xnor";
  name_22._M_len = 4;
  portDirs_22._M_len = 2;
  portDirs_22._M_array = local_48;
  gate(c,name_22,portDirs_22,NInput);
  local_48[0] = Out;
  local_48[1] = In;
  name_23._M_str = "buf";
  name_23._M_len = 3;
  portDirs_23._M_len = 2;
  portDirs_23._M_array = local_48;
  gate(c,name_23,portDirs_23,NOutput);
  local_48[0] = Out;
  local_48[1] = In;
  name_24._M_str = "not";
  name_24._M_len = 3;
  portDirs_24._M_len = 2;
  portDirs_24._M_array = local_48;
  gate(c,name_24,portDirs_24,NOutput);
  return;
}

Assistant:

void registerGateTypes(Compilation& c) {
    gate(c, "cmos", {out, in, in, in});
    gate(c, "rcmos", {out, in, in, in});
    gate(c, "bufif0", {out, in, in});
    gate(c, "bufif1", {out, in, in});
    gate(c, "notif0", {out, in, in});
    gate(c, "notif1", {out, in, in});
    gate(c, "nmos", {out, in, in});
    gate(c, "pmos", {out, in, in});
    gate(c, "rnmos", {out, in, in});
    gate(c, "rpmos", {out, in, in});
    gate(c, "tranif0", {inout, inout, in}, PrimitiveSymbol::BiDiSwitch);
    gate(c, "tranif1", {inout, inout, in}, PrimitiveSymbol::BiDiSwitch);
    gate(c, "rtranif0", {inout, inout, in});
    gate(c, "rtranif1", {inout, inout, in});
    gate(c, "tran", {inout, inout}, PrimitiveSymbol::BiDiSwitch);
    gate(c, "rtran", {inout, inout});
    gate(c, "pullup", {out});
    gate(c, "pulldown", {out});

    // These are special in that they support an arbitrary number of
    // either inputs or outputs.
    gate(c, "and", {out, in}, PrimitiveSymbol::NInput);
    gate(c, "or", {out, in}, PrimitiveSymbol::NInput);
    gate(c, "nand", {out, in}, PrimitiveSymbol::NInput);
    gate(c, "nor", {out, in}, PrimitiveSymbol::NInput);
    gate(c, "xor", {out, in}, PrimitiveSymbol::NInput);
    gate(c, "xnor", {out, in}, PrimitiveSymbol::NInput);
    gate(c, "buf", {out, in}, PrimitiveSymbol::NOutput);
    gate(c, "not", {out, in}, PrimitiveSymbol::NOutput);
}